

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PInt::PInt(PInt *this,uint size,bool unsign,bool compatible)

{
  PSymbolConstNumeric *pPVar1;
  undefined7 in_register_00000011;
  uint val;
  FName local_38;
  FName local_34;
  FName local_30;
  FName local_2c;
  
  PBasicType::PBasicType((PBasicType *)this,size,size);
  *(undefined ***)this = &PTR_StaticType_006ed360;
  this->Unsigned = unsign;
  this->IntCompatible = compatible;
  FString::Format((FString *)&this->field_0x60,"%cInt%d",
                  (ulong)((int)CONCAT71(in_register_00000011,unsign) * 2 + 0x53));
  this->field_0x58 = size < 4;
  if (unsign) {
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    local_34.Index = 0x264;
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_34,(PType *)this,0);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    local_38.Index = 0x265;
    PSymbolConstNumeric::PSymbolConstNumeric
              (pPVar1,&local_38,(PType *)this,~(-1 << ((byte)(size << 3) & 0x1f)));
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  }
  else {
    val = -1 << ((char)(size << 3) - 1U & 0x1f);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    local_2c.Index = 0x264;
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_2c,(PType *)this,val);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    local_30.Index = 0x265;
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_30,(PType *)this,~val);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  }
  SetOps(this);
  return;
}

Assistant:

PInt::PInt(unsigned int size, bool unsign, bool compatible)
: PBasicType(size, size), Unsigned(unsign), IntCompatible(compatible)
{
	mDescriptiveName.Format("%cInt%d", unsign? 'U':'S', size);

	MemberOnly = (size < 4);
	if (!unsign)
	{
		int maxval = (1 << ((8 * size) - 1)) - 1;
		int minval = -maxval - 1;
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, minval));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, maxval));
	}
	else
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, 0u));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, (1u << (8 * size)) - 1));
	}
	SetOps();
}